

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleLengthCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  long lVar2;
  char buffer [1024];
  string local_428 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar2 == 0x60) {
    sprintf((char *)local_428,"%d",(ulong)(uint)pbVar1[1]._M_string_length);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 2,(char *)local_428);
  }
  else {
    local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,"sub-command LENGTH requires two arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
      operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
    }
  }
  return lVar2 == 0x60;
}

Assistant:

bool cmStringCommand
::HandleLengthCommand(std::vector<std::string> const& args)
{
  if(args.size() != 3)
    {
    this->SetError("sub-command LENGTH requires two arguments.");
    return false;
    }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];

  size_t length = stringValue.size();
  char buffer[1024];
  sprintf(buffer, "%d", static_cast<int>(length));

  this->Makefile->AddDefinition(variableName, buffer);
  return true;
}